

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

QString * __thiscall
QUrlQueryPrivate::recodeToUser
          (QString *__return_storage_ptr__,QUrlQueryPrivate *this,QString *input,
          ComponentFormattingOptions encoding)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  qsizetype qVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QStringView in;
  QStringView in_00;
  undefined1 local_38 [16];
  qsizetype local_28;
  uint local_20 [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QFlagsStorage<QUrl::ComponentFormattingOption>)
      encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i ==
      (QFlagsStorage<QUrl::ComponentFormattingOption>)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00248cb8;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&input->d);
  }
  else {
    if (((uint)encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i & 0xc00000) == 0) {
      local_28 = 0;
      local_38 = (undefined1  [16])0x0;
      in_00.m_data = (input->d).ptr;
      in_00.m_size = (input->d).size;
      lVar7 = qt_urlRecode((QString *)local_38,in_00,encoding,(ushort *)0x0);
    }
    else {
      uVar1 = this->valueDelimiter;
      uVar2 = this->pairDelimiter;
      uVar3 = *(undefined4 *)&this->field_0x24;
      auVar8._4_4_ = uVar3;
      auVar8._2_2_ = uVar2;
      auVar8._0_2_ = uVar1;
      auVar8._8_8_ = 0;
      auVar8 = pshuflw(auVar8,auVar8,0xe1);
      local_20[0] = auVar8._0_4_ | (uint)DAT_00469180;
      local_20[1] = 0x223;
      local_28 = 0;
      local_38 = (undefined1  [16])0x0;
      in.m_data = (input->d).ptr;
      in.m_size = (input->d).size;
      lVar7 = qt_urlRecode((QString *)local_38,in,encoding,(ushort *)local_20);
    }
    qVar6 = local_28;
    if (lVar7 == 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&input->d);
    }
    else {
      uVar4 = local_38._0_8_;
      uVar5 = local_38._8_8_;
      local_38 = ZEXT816(0);
      (__return_storage_ptr__->d).d = (Data *)uVar4;
      (__return_storage_ptr__->d).ptr = (char16_t *)uVar5;
      local_28 = 0;
      (__return_storage_ptr__->d).size = qVar6;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00248cb8:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline QString QUrlQueryPrivate::recodeToUser(const QString &input, QUrl::ComponentFormattingOptions encoding) const
{
    // our internal formats are stored in "PrettyDecoded" form
    // and there are no ambiguous characters
    if (idempotentRecodeToUser(encoding))
        return input;

    if (!(encoding & QUrl::EncodeDelimiters)) {
        QString output;
        if (qt_urlRecode(output, input,
                         encoding, nullptr))
            return output;
        return input;
    }

    // re-encode the "#" character and the query delimiter pair
    ushort actions[] = { encode(pairDelimiter.unicode()), encode(valueDelimiter.unicode()),
                         encode('#'), 0 };
    QString output;
    if (qt_urlRecode(output, input, encoding, actions))
        return output;
    return input;
}